

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse.h
# Opt level: O1

array<unsigned_char,_8UL> mvm::num::serial_floating<double,8ul>(double val)

{
  undefined1 auVar1 [16];
  array<unsigned_char,_8UL> aVar2;
  uint uVar3;
  _Type auVar4;
  uint uVar5;
  double dVar6;
  undefined8 in_XMM0_Qb;
  int32_t exp;
  uint local_2c;
  double local_28;
  undefined8 uStack_20;
  
  local_28 = val;
  uStack_20 = in_XMM0_Qb;
  dVar6 = frexp(val,(int *)&local_2c);
  uVar3 = local_2c + 0x3fe;
  auVar1._8_8_ = uStack_20;
  auVar1._0_8_ = local_28;
  uVar5 = movmskpd((int)&local_2c,auVar1);
  local_2c = uVar3;
  dVar6 = ldexp(ABS(dVar6) + ABS(dVar6) + -1.0,0x34);
  auVar4 = (_Type)((ulong)(uVar3 & 0x7ff) << 0x34 |
                   ((long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6) &
                   0xfffffffffffffU | (ulong)uVar5 << 0x3f);
  aVar2._M_elems[0] = auVar4[0];
  aVar2._M_elems[1] = auVar4[1];
  aVar2._M_elems[2] = auVar4[2];
  aVar2._M_elems[3] = auVar4[3];
  aVar2._M_elems[4] = auVar4[4];
  aVar2._M_elems[5] = auVar4[5];
  aVar2._M_elems[6] = auVar4[6];
  aVar2._M_elems[7] = auVar4[7];
  return (array<unsigned_char,_8UL>)aVar2._M_elems;
}

Assistant:

auto serial_floating(double val) {
  T tval = static_cast<T>(val);

  if constexpr (N == 4 || N == 8) {
    using ieee754_type = traits::ieee754_traits<N>;
    using unsigned_type = typename ieee754_type::unsigned_type;

    int32_t exp;
    auto d_mant = std::frexp(tval, &exp);

    // exp to store
    exp = exp - 1 + ieee754_type::exp_shift; // -1 because the radix point is
                                             // shifted in frexp

    unsigned_type neg = std::signbit(tval);
    d_mant = fabs(d_mant) * 2 - 1; // again the shift is the radix point

    unsigned_type u_exp = exp;
    unsigned_type u_mant =
        static_cast<unsigned_type>(std::ldexp(d_mant, ieee754_type::mant_size));

    unsigned_type u_bytes;
    u_bytes = (u_mant & ieee754_type::mant_mask);
    u_bytes |= ((u_exp & ieee754_type::exp_mask) << ieee754_type::mant_size);
    u_bytes |=
        ((neg & 0x1) << (ieee754_type::mant_size + ieee754_type::exp_size));

    return serial_unsigned<N>(u_bytes);
  }
}